

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambdaref_expression.cpp
# Opt level: O1

bool __thiscall
duckdb::BoundLambdaRefExpression::Equals(BoundLambdaRefExpression *this,BaseExpression *other_p)

{
  bool bVar1;
  BoundLambdaRefExpression *pBVar2;
  
  bVar1 = BaseExpression::Equals((BaseExpression *)this,other_p);
  if ((bVar1) &&
     (bVar1 = LogicalType::operator==
                        (&(this->super_Expression).return_type,(LogicalType *)(other_p + 1)), bVar1)
     ) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundLambdaRefExpression>(other_p);
    if ((pBVar2->binding).table_index != (this->binding).table_index) {
      return false;
    }
    if ((pBVar2->binding).column_index != (this->binding).column_index) {
      return false;
    }
    if (pBVar2->lambda_idx == this->lambda_idx) {
      return pBVar2->depth == this->depth;
    }
  }
  return false;
}

Assistant:

bool BoundLambdaRefExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundLambdaRefExpression>();
	return other.binding == binding && other.lambda_idx == lambda_idx && other.depth == depth;
}